

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.c
# Opt level: O0

int32 hmm_vit_eval_anytopo(hmm_t *hmm)

{
  uint16 uVar1;
  hmm_context_t *phVar2;
  uint uVar3;
  int iVar4;
  int local_7c;
  uint local_78;
  uint local_74;
  int local_68;
  uint local_58;
  uint local_54;
  int local_44;
  int local_30;
  int final_state;
  int32 bestscr;
  int32 scr;
  int32 newscr;
  int32 bestfrom;
  int32 from;
  int32 to;
  hmm_context_t *ctx;
  hmm_t *hmm_local;
  
  phVar2 = hmm->ctx;
  if (hmm->mpx == '\0') {
    uVar1 = hmm->senid[0];
  }
  else if (hmm->senid[0] == 0xffff) {
    uVar1 = 0xffff;
  }
  else {
    uVar1 = *hmm->ctx->sseq[hmm->senid[0]];
  }
  if (uVar1 == 0xffff) {
    local_44 = -0x20000000;
  }
  else {
    if (hmm->mpx == '\0') {
      local_58 = (uint)hmm->senid[0];
    }
    else {
      if (hmm->senid[0] == 0xffff) {
        local_54 = 0xffff;
      }
      else {
        local_54 = (uint)*hmm->ctx->sseq[hmm->senid[0]];
      }
      local_58 = local_54;
    }
    local_44 = -(int)hmm->ctx->senscore[(int)local_58];
  }
  *phVar2->st_sen_scr = hmm->score[0] + local_44;
  for (newscr = 1; newscr < (int)(uint)hmm->n_emit_state; newscr = newscr + 1) {
    if (hmm->mpx == '\0') {
      uVar1 = hmm->senid[newscr];
    }
    else if (hmm->senid[newscr] == 0xffff) {
      uVar1 = 0xffff;
    }
    else {
      uVar1 = hmm->ctx->sseq[hmm->senid[newscr]][newscr];
    }
    if (uVar1 == 0xffff) {
      local_68 = -0x20000000;
    }
    else {
      if (hmm->mpx == '\0') {
        local_78 = (uint)hmm->senid[newscr];
      }
      else {
        if (hmm->senid[newscr] == 0xffff) {
          local_74 = 0xffff;
        }
        else {
          local_74 = (uint)hmm->ctx->sseq[hmm->senid[newscr]][newscr];
        }
        local_78 = local_74;
      }
      local_68 = -(int)hmm->ctx->senscore[(int)local_78];
    }
    local_68 = hmm->score[newscr] + local_68;
    phVar2->st_sen_scr[newscr] = local_68;
    if (local_68 < -0x20000000) {
      phVar2->st_sen_scr[newscr] = -0x20000000;
    }
  }
  uVar3 = (uint)hmm->n_emit_state;
  final_state = -0x20000000;
  scr = -1;
  newscr = uVar3;
  while (newscr = newscr - 1, -1 < newscr) {
    if ((-0xff < (int)-(uint)hmm->ctx->tp[hmm->tmatid][newscr][(int)uVar3]) &&
       (iVar4 = phVar2->st_sen_scr[newscr] - (uint)hmm->ctx->tp[hmm->tmatid][newscr][(int)uVar3],
       final_state < iVar4)) {
      scr = newscr;
      final_state = iVar4;
    }
  }
  hmm->out_score = final_state;
  if (-1 < scr) {
    hmm->out_history = hmm->history[scr];
  }
  local_30 = final_state;
  while (bestfrom = uVar3 - 1, -1 < bestfrom) {
    if ((int)-(uint)hmm->ctx->tp[hmm->tmatid][bestfrom][bestfrom] < -0xfe) {
      local_7c = -0x20000000;
    }
    else {
      local_7c = phVar2->st_sen_scr[bestfrom] - (uint)hmm->ctx->tp[hmm->tmatid][bestfrom][bestfrom];
    }
    final_state = local_7c;
    scr = -1;
    for (newscr = uVar3 - 2; -1 < newscr; newscr = newscr + -1) {
      if ((-0xff < (int)-(uint)hmm->ctx->tp[hmm->tmatid][newscr][bestfrom]) &&
         (iVar4 = phVar2->st_sen_scr[newscr] - (uint)hmm->ctx->tp[hmm->tmatid][newscr][bestfrom],
         final_state < iVar4)) {
        scr = newscr;
        final_state = iVar4;
      }
    }
    if (bestfrom == 0) {
      hmm->score[0] = final_state;
      if (-1 < scr) {
        hmm->history[0] = hmm->history[scr];
      }
    }
    else {
      hmm->score[bestfrom] = final_state;
      if (-1 < scr) {
        hmm->history[bestfrom] = hmm->history[scr];
      }
    }
    if ((-1 < scr) && (hmm->mpx != '\0')) {
      hmm->senid[bestfrom] = hmm->senid[scr];
    }
    uVar3 = bestfrom;
    if (local_30 < final_state) {
      local_30 = final_state;
    }
  }
  hmm->bestscore = local_30;
  return local_30;
}

Assistant:

static int32
hmm_vit_eval_anytopo(hmm_t * hmm)
{
    hmm_context_t *ctx = hmm->ctx;
    int32 to, from, bestfrom;
    int32 newscr, scr, bestscr;
    int final_state;

    /* Compute previous state-score + observation output prob for each emitting state */
    ctx->st_sen_scr[0] = hmm_in_score(hmm) + hmm_senscr(hmm, 0);
    for (from = 1; from < hmm_n_emit_state(hmm); ++from) {
        if ((ctx->st_sen_scr[from] =
             hmm_score(hmm, from) + hmm_senscr(hmm, from)) WORSE_THAN WORST_SCORE)
            ctx->st_sen_scr[from] = WORST_SCORE;
    }

    /* FIXME/TODO: Use the BLAS for all this. */
    /* Evaluate final-state first, which does not have a self-transition */
    final_state = hmm_n_emit_state(hmm);
    to = final_state;
    scr = WORST_SCORE;
    bestfrom = -1;
    for (from = to - 1; from >= 0; --from) {
        if ((hmm_tprob(hmm, from, to) BETTER_THAN TMAT_WORST_SCORE) &&
            ((newscr = ctx->st_sen_scr[from]
              + hmm_tprob(hmm, from, to)) BETTER_THAN scr)) {
            scr = newscr;
            bestfrom = from;
        }
    }
    hmm_out_score(hmm) = scr;
    if (bestfrom >= 0)
        hmm_out_history(hmm) = hmm_history(hmm, bestfrom);
    bestscr = scr;

    /* Evaluate all other states, which might have self-transitions */
    for (to = final_state - 1; to >= 0; --to) {
        /* Score from self-transition, if any */
        scr =
            (hmm_tprob(hmm, to, to) BETTER_THAN TMAT_WORST_SCORE)
            ? ctx->st_sen_scr[to] + hmm_tprob(hmm, to, to)
            : WORST_SCORE;

        /* Scores from transitions from other states */
        bestfrom = -1;
        for (from = to - 1; from >= 0; --from) {
            if ((hmm_tprob(hmm, from, to) BETTER_THAN TMAT_WORST_SCORE) &&
                ((newscr = ctx->st_sen_scr[from]
                  + hmm_tprob(hmm, from, to)) BETTER_THAN scr)) {
                scr = newscr;
                bestfrom = from;
            }
        }

        /* Update new result for state to */
        if (to == 0) {
            hmm_in_score(hmm) = scr;
            if (bestfrom >= 0)
                hmm_in_history(hmm) = hmm_history(hmm, bestfrom);
        }
        else {
            hmm_score(hmm, to) = scr;
            if (bestfrom >= 0)
                hmm_history(hmm, to) = hmm_history(hmm, bestfrom);
        }
        /* Propagate ssid for multiplex HMMs */
        if (bestfrom >= 0 && hmm_is_mpx(hmm))
            hmm->senid[to] = hmm->senid[bestfrom];

        if (bestscr WORSE_THAN scr)
            bestscr = scr;
    }

    hmm_bestscore(hmm) = bestscr;
    return bestscr;
}